

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bss_sock.c
# Opt level: O0

long sock_ctrl(BIO *b,int cmd,long num,void *ptr)

{
  undefined4 *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  int *ip;
  long ret;
  undefined4 in_stack_ffffffffffffffc8;
  undefined8 local_28;
  
  local_28 = 1;
  if (in_ESI == 2) {
    local_28 = (long)(int)(uint)((*(uint *)(in_RDI + 0x30) & 0x800) != 0);
  }
  else if (in_ESI == 8) {
    local_28 = (long)*(int *)(in_RDI + 0x2c);
  }
  else if (in_ESI == 9) {
    *(undefined4 *)(in_RDI + 0x2c) = in_EDX;
  }
  else if (in_ESI - 0xbU < 2) {
    local_28 = 1;
  }
  else if (in_ESI == 0x68) {
    sock_free((BIO *)CONCAT44(0x68,in_stack_ffffffffffffffc8));
    *(undefined4 *)(in_RDI + 0x38) = *in_RCX;
    *(undefined4 *)(in_RDI + 0x2c) = in_EDX;
    *(undefined4 *)(in_RDI + 0x28) = 1;
  }
  else if (in_ESI == 0x69) {
    if (*(int *)(in_RDI + 0x28) == 0) {
      local_28 = -1;
    }
    else {
      if (in_RCX != (undefined4 *)0x0) {
        *in_RCX = *(undefined4 *)(in_RDI + 0x38);
      }
      local_28 = (long)*(int *)(in_RDI + 0x38);
    }
  }
  else {
    local_28 = 0;
  }
  return local_28;
}

Assistant:

static long sock_ctrl(BIO *b, int cmd, long num, void *ptr)
{
    long ret = 1;
    int *ip;
# ifndef OPENSSL_NO_KTLS
    ktls_crypto_info_t *crypto_info;
# endif

    switch (cmd) {
    case BIO_C_SET_FD:
        sock_free(b);
        b->num = *((int *)ptr);
        b->shutdown = (int)num;
        b->init = 1;
        break;
    case BIO_C_GET_FD:
        if (b->init) {
            ip = (int *)ptr;
            if (ip != NULL)
                *ip = b->num;
            ret = b->num;
        } else
            ret = -1;
        break;
    case BIO_CTRL_GET_CLOSE:
        ret = b->shutdown;
        break;
    case BIO_CTRL_SET_CLOSE:
        b->shutdown = (int)num;
        break;
    case BIO_CTRL_DUP:
    case BIO_CTRL_FLUSH:
        ret = 1;
        break;
# ifndef OPENSSL_NO_KTLS
    case BIO_CTRL_SET_KTLS:
        crypto_info = (ktls_crypto_info_t *)ptr;
        ret = ktls_start(b->num, crypto_info, num);
        if (ret)
            BIO_set_ktls_flag(b, num);
        break;
    case BIO_CTRL_GET_KTLS_SEND:
        return BIO_should_ktls_flag(b, 1) != 0;
    case BIO_CTRL_GET_KTLS_RECV:
        return BIO_should_ktls_flag(b, 0) != 0;
    case BIO_CTRL_SET_KTLS_TX_SEND_CTRL_MSG:
        BIO_set_ktls_ctrl_msg_flag(b);
        b->ptr = (void *)num;
        ret = 0;
        break;
    case BIO_CTRL_CLEAR_KTLS_TX_CTRL_MSG:
        BIO_clear_ktls_ctrl_msg_flag(b);
        ret = 0;
        break;
# endif
    case BIO_CTRL_EOF:
        ret = (b->flags & BIO_FLAGS_IN_EOF) != 0;
        break;
    default:
        ret = 0;
        break;
    }
    return ret;
}